

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
emplace_back<slang::ast::ForeachLoopStatement::LoopDim>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,LoopDim *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  _Storage<slang::ConstantRange,_true> *p_Var5;
  undefined8 uVar6;
  _Storage<slang::ConstantRange,_true> _Var7;
  pointer pLVar8;
  size_type sVar9;
  pointer pLVar10;
  pointer pLVar11;
  long lVar12;
  pointer pLVar13;
  ulong capacity;
  long lVar14;
  
  pLVar13 = this->data_ + this->len;
  if (this->len == this->cap) {
    if (this->len == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = this->len + 1;
    uVar4 = this->cap;
    if (capacity < uVar4 * 2) {
      capacity = uVar4 * 2;
    }
    if (0x7fffffffffffffff - uVar4 < uVar4) {
      capacity = 0x7fffffffffffffff;
    }
    lVar14 = (long)pLVar13 - (long)this->data_;
    pLVar10 = (pointer)detail::allocArray(capacity,0x18);
    *(IteratorSymbol **)((long)pLVar10 + lVar14 + 0x10) = args->loopVar;
    _Var7 = *(_Storage<slang::ConstantRange,_true> *)
             &(args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange>._M_engaged;
    *(_Storage<slang::ConstantRange,_true> *)((long)pLVar10 + lVar14) =
         (args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>._M_payload;
    ((_Storage<slang::ConstantRange,_true> *)((long)pLVar10 + lVar14))[1] = _Var7;
    pLVar11 = this->data_;
    sVar3 = this->len;
    pLVar8 = pLVar10;
    if (pLVar11 + sVar3 == pLVar13) {
      if (sVar3 != 0) {
        lVar12 = 0;
        do {
          *(undefined8 *)((long)&pLVar10->loopVar + lVar12) =
               *(undefined8 *)((long)&pLVar11->loopVar + lVar12);
          puVar1 = (undefined8 *)
                   ((long)&(pLVar11->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                           _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload
                   + lVar12);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)
                   ((long)&(pLVar10->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                           _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload
                   + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          lVar12 = lVar12 + 0x18;
        } while (sVar3 * 0x18 != lVar12);
      }
    }
    else {
      for (; pLVar11 != pLVar13; pLVar11 = pLVar11 + 1) {
        pLVar8->loopVar = pLVar11->loopVar;
        uVar6 = *(undefined8 *)
                 &(pLVar11->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload
                  .super__Optional_payload_base<slang::ConstantRange>._M_engaged;
        (pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_payload =
             (pLVar11->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ConstantRange>._M_payload;
        *(undefined8 *)
         &(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar6;
        pLVar8 = pLVar8 + 1;
      }
      sVar3 = this->len;
      pLVar11 = this->data_;
      if (pLVar11 + sVar3 != pLVar13) {
        p_Var5 = (_Storage<slang::ConstantRange,_true> *)(lVar14 + (long)pLVar10);
        do {
          p_Var5[5] = (_Storage<slang::ConstantRange,_true>)pLVar13->loopVar;
          _Var7 = *(_Storage<slang::ConstantRange,_true> *)
                   &(pLVar13->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                    _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_engaged;
          p_Var5[3] = (pLVar13->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                      _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload;
          p_Var5[4] = _Var7;
          pLVar13 = pLVar13 + 1;
          p_Var5 = p_Var5 + 3;
        } while (pLVar13 != pLVar11 + sVar3);
      }
    }
    if (this->data_ != (pointer)this->firstElement) {
      free(this->data_);
    }
    this->len = this->len + 1;
    this->cap = capacity;
    this->data_ = pLVar10;
    return (reference)((long)pLVar10 + lVar14);
  }
  pLVar13->loopVar = args->loopVar;
  uVar6 = *(undefined8 *)
           &(args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged;
  (pLVar13->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload =
       (args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ConstantRange>._M_payload;
  *(undefined8 *)
   &(pLVar13->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar6;
  sVar3 = this->len;
  sVar9 = sVar3 + 1;
  this->len = sVar9;
  if (sVar9 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::back() [T = slang::ast::ForeachLoopStatement::LoopDim]"
              );
  }
  return this->data_ + sVar3;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }